

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void init_frame(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,int stackpos,int stacktop
               )

{
  sljit_compiler *compiler_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int offset;
  BOOL capture_last_found;
  BOOL setmark_found;
  BOOL setsom_found;
  sljit_compiler *compiler;
  int stacktop_local;
  int stackpos_local;
  PCRE2_SPTR16 ccend_local;
  PCRE2_SPTR16 cc_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  compiler._4_4_ = stackpos << 3;
  ccend_local = cc;
  _stacktop_local = ccend;
  if (ccend == (PCRE2_SPTR16)0x0) {
    _stacktop_local = bracketend(cc);
    _stacktop_local = _stacktop_local + -2;
    if ((*cc != 0x86) && (*cc != 0x8b)) {
      ccend_local = next_opcode(common,cc);
    }
  }
  while (ccend_local < _stacktop_local) {
    uVar4 = (uint)*ccend_local;
    if (uVar4 == 3) {
      if (!bVar1) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->ovector_start);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,-(long)common->ovector_start)
        ;
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -8),1,0);
        compiler._4_4_ = compiler._4_4_ + -0x10;
        bVar1 = true;
      }
      ccend_local = ccend_local + 1;
    }
    else if (uVar4 == 0x75) {
      if ((common->has_set_som != 0) && (!bVar1)) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->ovector_start);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,-(long)common->ovector_start)
        ;
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -8),1,0);
        compiler._4_4_ = compiler._4_4_ + -0x10;
        bVar1 = true;
      }
      if ((common->mark_ptr != 0) && (!bVar2)) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->mark_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,(long)-common->mark_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -8),1,0);
        compiler._4_4_ = compiler._4_4_ + -0x10;
        bVar2 = true;
      }
      if ((common->capture_last_ptr != 0) && (!bVar3)) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->capture_last_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,
                       (long)-common->capture_last_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -8),1,0);
        compiler._4_4_ = compiler._4_4_ + -0x10;
        bVar3 = true;
      }
      ccend_local = ccend_local + 2;
    }
    else if ((uVar4 - 0x85 < 2) || (uVar4 - 0x8a < 2)) {
      if ((common->capture_last_ptr != 0) && (!bVar3)) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->capture_last_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,
                       (long)-common->capture_last_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -8),1,0);
        compiler._4_4_ = compiler._4_4_ + -0x10;
        bVar3 = true;
      }
      iVar5 = (uint)ccend_local[2] * 2;
      sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,
                     (long)common->ovector_start + (long)iVar5 * 8);
      sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->ovector_start + (long)iVar5 * 8);
      sljit_emit_op1(compiler_00,0x20,4,0,0x8e,(long)common->ovector_start + (long)(iVar5 + 1) * 8);
      sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -8),1,0);
      sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -0x10),4,0);
      compiler._4_4_ = compiler._4_4_ + -0x18;
      ccend_local = ccend_local + 3;
    }
    else if ((((uVar4 == 0x96) || (uVar4 == 0x98)) || (uVar4 == 0x9c)) || (uVar4 == 0x9e)) {
      if (!bVar2) {
        sljit_emit_op1(compiler_00,0x20,1,0,0x8e,(long)common->mark_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,(long)-common->mark_ptr);
        sljit_emit_op1(compiler_00,0x20,0x8c,(long)(compiler._4_4_ + -8),1,0);
        compiler._4_4_ = compiler._4_4_ + -0x10;
        bVar2 = true;
      }
      ccend_local = ccend_local + (int)(ccend_local[1] + 3);
    }
    else {
      ccend_local = next_opcode(common,ccend_local);
    }
  }
  sljit_emit_op1(compiler_00,0x20,0x8c,(long)compiler._4_4_,0x40,0);
  return;
}

Assistant:

static void init_frame(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend, int stackpos, int stacktop)
{
DEFINE_COMPILER;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
/* The last capture is a local variable even for recursions. */
BOOL capture_last_found = FALSE;
int offset;

/* >= 1 + shortest item size (2) */
SLJIT_UNUSED_ARG(stacktop);
SLJIT_ASSERT(stackpos >= stacktop + 2);

stackpos = STACK(stackpos);
if (ccend == NULL)
  {
  ccend = bracketend(cc) - (1 + LINK_SIZE);
  if (*cc != OP_CBRAPOS && *cc != OP_SCBRAPOS)
    cc = next_opcode(common, cc);
  }

SLJIT_ASSERT(cc != NULL);
while (cc < ccend)
  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    if (!setsom_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -OVECTOR(0));
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setsom_found = TRUE;
      }
    cc += 1;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (!setmark_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->mark_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setmark_found = TRUE;
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_RECURSE:
    if (common->has_set_som && !setsom_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -OVECTOR(0));
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setsom_found = TRUE;
      }
    if (common->mark_ptr != 0 && !setmark_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->mark_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setmark_found = TRUE;
      }
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->capture_last_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      capture_last_found = TRUE;
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_CBRAPOS:
    case OP_SCBRA:
    case OP_SCBRAPOS:
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->capture_last_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      capture_last_found = TRUE;
      }
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, OVECTOR(offset));
    stackpos -= (int)sizeof(sljit_sw);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
    stackpos -= (int)sizeof(sljit_sw);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP2, 0);
    stackpos -= (int)sizeof(sljit_sw);

    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }

OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, 0);
SLJIT_ASSERT(stackpos == STACK(stacktop));
}